

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::mouseMoveEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  int iVar1;
  AbstractScrollAreaPrivate *pAVar2;
  QPoint __addr_len;
  sockaddr *__addr;
  QPoint local_30;
  int local_28;
  QPoint QStack_24;
  int dx;
  int local_1c;
  QMouseEvent *pQStack_18;
  int dy;
  QMouseEvent *e_local;
  AbstractScrollArea *this_local;
  
  pQStack_18 = e;
  e_local = (QMouseEvent *)this;
  pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if ((pAVar2->leftMouseButtonPressed & 1U) == 0) {
    QEvent::ignore((QEvent *)pQStack_18);
  }
  else {
    QStack_24 = QMouseEvent::pos(pQStack_18);
    iVar1 = QPoint::y(&stack0xffffffffffffffdc);
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    local_1c = QPoint::y(&pAVar2->mousePos);
    local_1c = iVar1 - local_1c;
    local_30 = QMouseEvent::pos(pQStack_18);
    iVar1 = QPoint::x(&local_30);
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    local_28 = QPoint::x(&pAVar2->mousePos);
    local_28 = iVar1 - local_28;
    __addr_len = QMouseEvent::pos(pQStack_18);
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    pAVar2->mousePos = __addr_len;
    pAVar2 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::scrollContentsBy(pAVar2,local_28,local_1c);
    iVar1 = local_28;
    (**(code **)(*(long *)this + 0x1b0))(this,local_28,local_1c);
    QEvent::accept((QEvent *)pQStack_18,iVar1,__addr,(socklen_t *)__addr_len);
  }
  return;
}

Assistant:

void
AbstractScrollArea::mouseMoveEvent( QMouseEvent * e )
{
	if( d->leftMouseButtonPressed )
	{
		const int dy = e->pos().y() - d->mousePos.y();
		const int dx = e->pos().x() - d->mousePos.x();

		d->mousePos = e->pos();

		d->scrollContentsBy( dx, dy );

		scrollContentsBy( dx, dy );

		e->accept();
	}
	else
		e->ignore();
}